

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

string * __thiscall
gl4cts::GPUShaderFP64Test7::getVariableDeclarations_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,char *prefix,
          _variables *variables,char *layout_qualifier)

{
  uint uVar1;
  pointer p_Var2;
  bool bVar3;
  string *psVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  ostream *poVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  string variable_type_string;
  stringstream result_sstream;
  string local_1f8;
  string *local_1d8;
  ulong local_1d0;
  char *local_1c8;
  _variables *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1d8 = __return_storage_ptr__;
  local_1c8 = layout_qualifier;
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar6 = (long)(variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(variables->
                super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_1c0 = variables;
  if (lVar6 != 0) {
    local_1d0 = (lVar6 >> 2) * -0x5555555555555555;
    uVar9 = extraout_RDX;
    uVar10 = 0;
    uVar11 = 1;
    do {
      p_Var2 = (local_1c0->
               super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar1 = p_Var2[uVar10].array_size;
      Utils::getVariableTypeString_abi_cxx11_
                (&local_1f8,(Utils *)(ulong)p_Var2[uVar10].type,(_variable_type)uVar9);
      pcVar5 = local_1c8;
      if (local_1c8 == (char *)0x0) {
        std::ios::clear((int)*(_func_int **)(local_1a8._0_8_ + -0x18) + (int)(ostream *)local_1a8);
      }
      else {
        sVar7 = strlen(local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,local_1f8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      if (prefix == (char *)0x0) {
        std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
      }
      else {
        sVar7 = strlen(prefix);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,prefix,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_variable",9);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      if (1 < uVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
      uVar9 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        uVar9 = extraout_RDX_01;
      }
      bVar3 = uVar11 < local_1d0;
      uVar10 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar3);
  }
  psVar4 = local_1d8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar4;
}

Assistant:

std::string GPUShaderFP64Test7::getVariableDeclarations(const char* prefix, const _variables& variables,
														const char* layout_qualifier)
{
	std::stringstream result_sstream;

	/* Define output variables */
	const size_t n_variables = variables.size();

	for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
	{
		unsigned int		  variable_array_size  = variables[n_variable].array_size;
		Utils::_variable_type variable_type		   = variables[n_variable].type;
		std::string			  variable_type_string = Utils::getVariableTypeString(variable_type);

		result_sstream << layout_qualifier << " " << variable_type_string << " " << prefix << "_variable" << n_variable;

		if (variable_array_size > 1)
		{
			result_sstream << "[" << variable_array_size << "]";
		}

		result_sstream << ";\n";
	} /* for (all user-specified variable types) */

	return result_sstream.str();
}